

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjpeg.c
# Opt level: O0

void opj_setup_decoder(opj_dinfo_t *dinfo,opj_dparameters_t *parameters)

{
  uint uVar1;
  opj_j2k_t *in_RSI;
  long in_RDI;
  undefined4 in_stack_ffffffffffffffe8;
  
  if (((in_RDI != 0) && (in_RSI != (opj_j2k_t *)0x0)) &&
     (uVar1 = *(uint *)(in_RDI + 0x14), uVar1 != 0xffffffff)) {
    if (uVar1 < 2) {
      j2k_setup_decoder(in_RSI,(opj_dparameters_t *)CONCAT44(uVar1,in_stack_ffffffffffffffe8));
    }
    else if (uVar1 == 2) {
      jp2_setup_decoder((opj_jp2_t *)in_RSI,
                        (opj_dparameters_t *)CONCAT44(2,in_stack_ffffffffffffffe8));
    }
  }
  return;
}

Assistant:

void OPJ_CALLCONV opj_setup_decoder(opj_dinfo_t *dinfo, opj_dparameters_t *parameters) {
	if(dinfo && parameters) {
		switch(dinfo->codec_format) {
			case CODEC_J2K:
			case CODEC_JPT:
				j2k_setup_decoder((opj_j2k_t*)dinfo->j2k_handle, parameters);
				break;
			case CODEC_JP2:
				jp2_setup_decoder((opj_jp2_t*)dinfo->jp2_handle, parameters);
				break;
			case CODEC_UNKNOWN:
			default:
				break;
		}
	}
}